

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O3

date_time * __thiscall
booster::locale::date_time::operator=(date_time *this,date_time_period_set *s)

{
  uint uVar1;
  abstract_calendar *paVar2;
  size_t sVar3;
  date_time_period *pdVar4;
  size_t sVar5;
  uint uVar6;
  
  sVar3 = date_time_period_set::size(s);
  if (sVar3 != 0) {
    uVar6 = 1;
    sVar3 = 0;
    do {
      paVar2 = (this->impl_).ptr_;
      pdVar4 = date_time_period_set::operator[](s,sVar3);
      uVar1 = *(uint *)pdVar4;
      pdVar4 = date_time_period_set::operator[](s,sVar3);
      (*paVar2->_vptr_abstract_calendar[1])(paVar2,(ulong)uVar1,(ulong)*(uint *)(pdVar4 + 4));
      sVar3 = (size_t)uVar6;
      sVar5 = date_time_period_set::size(s);
      uVar6 = uVar6 + 1;
    } while (sVar3 < sVar5);
  }
  (*((this->impl_).ptr_)->_vptr_abstract_calendar[2])();
  return this;
}

Assistant:

date_time const &date_time::operator=(date_time_period_set const &s)
{
    for(unsigned i=0;i<s.size();i++)
        impl_->set_value(s[i].type.mark(),s[i].value);
    impl_->normalize();
    return *this;
}